

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_object.cpp
# Opt level: O2

void mjs::anon_unknown_33::define_accessor_property
               (gc_heap_ptr<mjs::global_object> *global,object_ptr *o,string *name,value *get,
               value *set,property_attribute attr)

{
  bool bVar1;
  object *this;
  gc_heap_ptr_untyped local_40;
  
  bVar1 = is_valid(attr);
  if (bVar1) {
    bVar1 = has_attributes(attr,accessor);
    if (!bVar1) {
      this = (object *)gc_heap_ptr_untyped::get(&o->super_gc_heap_ptr_untyped);
      make_accessor_object((mjs *)&local_40,global,get,set);
      object::define_accessor_property(this,name,(object_ptr *)&local_40,attr);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_40);
      return;
    }
  }
  __assert_fail("is_valid(attr) && !has_attributes(attr, property_attribute::accessor)",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object_object.cpp"
                ,0x44,
                "void mjs::(anonymous namespace)::define_accessor_property(const gc_heap_ptr<global_object> &, const object_ptr &, const string &, const value &, const value &, property_attribute)"
               );
}

Assistant:

void define_accessor_property(const gc_heap_ptr<global_object>& global, const object_ptr& o, const string& name, const value& get, const value& set, property_attribute attr) {
    assert(is_valid(attr) && !has_attributes(attr, property_attribute::accessor));
    o->define_accessor_property(name, make_accessor_object(global, get, set), attr);
}